

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O0

void __thiscall MinVR::element::~element(element *this)

{
  attribute *paVar1;
  bool bVar2;
  reference ppaVar3;
  reference ppeVar4;
  long in_RDI;
  list<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_> *in_stack_ffffffffffffff98;
  attribute *in_stack_ffffffffffffffa0;
  element *peVar5;
  _Self local_30;
  _List_node_base *local_28;
  _List_node_base *local_20;
  _Self local_18;
  iterator in_stack_fffffffffffffff0;
  
  if ((*(byte *)(in_RDI + 0x79) & 1) != 0) {
    free(*(void **)(in_RDI + 0x80));
  }
  if ((*(byte *)(in_RDI + 0x78) & 1) == 0) {
    in_stack_fffffffffffffff0 =
         std::__cxx11::list<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>::begin
                   (in_stack_ffffffffffffff98);
    *(_List_node_base **)(in_RDI + 0x18) = in_stack_fffffffffffffff0._M_node;
    while( true ) {
      local_18._M_node =
           (_List_node_base *)
           std::__cxx11::list<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>::end
                     (in_stack_ffffffffffffff98);
      bVar2 = std::operator!=((_Self *)(in_RDI + 0x18),&local_18);
      if (!bVar2) break;
      ppaVar3 = std::_List_iterator<MinVR::attribute_*>::operator*
                          ((_List_iterator<MinVR::attribute_*> *)0x1595de);
      paVar1 = *ppaVar3;
      if (paVar1 != (attribute *)0x0) {
        attribute::~attribute(in_stack_ffffffffffffffa0);
        operator_delete(paVar1,0x18);
      }
      local_20 = (_List_node_base *)
                 std::_List_iterator<MinVR::attribute_*>::operator++
                           ((_List_iterator<MinVR::attribute_*> *)(in_RDI + 0x18),0);
    }
  }
  local_28 = (_List_node_base *)
             std::__cxx11::list<MinVR::element_*,_std::allocator<MinVR::element_*>_>::begin
                       ((list<MinVR::element_*,_std::allocator<MinVR::element_*>_> *)
                        in_stack_ffffffffffffff98);
  *(_List_node_base **)(in_RDI + 0x48) = local_28;
  while( true ) {
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::list<MinVR::element_*,_std::allocator<MinVR::element_*>_>::end
                   ((list<MinVR::element_*,_std::allocator<MinVR::element_*>_> *)
                    in_stack_ffffffffffffff98);
    bVar2 = std::operator!=((_Self *)(in_RDI + 0x48),&local_30);
    if (!bVar2) break;
    ppeVar4 = std::_List_iterator<MinVR::element_*>::operator*
                        ((_List_iterator<MinVR::element_*> *)0x159684);
    peVar5 = *ppeVar4;
    if (peVar5 != (element *)0x0) {
      ~element((element *)in_stack_fffffffffffffff0._M_node);
      operator_delete(peVar5,0xb0);
    }
    std::_List_iterator<MinVR::element_*>::operator++
              ((_List_iterator<MinVR::element_*> *)(in_RDI + 0x48),0);
  }
  std::__cxx11::string::~string((string *)(in_RDI + 0x88));
  std::__cxx11::list<char_*,_std::allocator<char_*>_>::~list
            ((list<char_*,_std::allocator<char_*>_> *)0x1596e1);
  std::__cxx11::list<MinVR::element_*,_std::allocator<MinVR::element_*>_>::~list
            ((list<MinVR::element_*,_std::allocator<MinVR::element_*>_> *)0x1596ef);
  std::__cxx11::list<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>::~list
            ((list<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_> *)0x1596f9);
  return;
}

Assistant:

element::~element()
{
    //if(value_is_allocated)
        //free(m_value);
    if(name_is_allocated)
        free(m_name);
    if(is_empty_attribute_list == false)
    {
        it = m_attribute_list.begin();
        while(it != m_attribute_list.end())
        {
            delete(*it);
            it++;
        }
    }
    i = m_element_list.begin();
    while(i != m_element_list.end())
    {
        delete(*i);
        i++;
    }
}